

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_s2polyline_vector_layer.cc
# Opt level: O0

void __thiscall
s2builderutil::S2PolylineVectorLayer::Init
          (S2PolylineVectorLayer *this,
          vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
          *polylines,LabelSetIds *label_set_ids,IdSetLexicon *label_set_lexicon,Options *options)

{
  PolylineType PVar1;
  SiblingPairs SVar2;
  S2Debug SVar3;
  ostream *poVar4;
  S2LogMessage local_48;
  S2LogMessageVoidify local_31;
  Options *local_30;
  Options *options_local;
  IdSetLexicon *label_set_lexicon_local;
  LabelSetIds *label_set_ids_local;
  vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
  *polylines_local;
  S2PolylineVectorLayer *this_local;
  
  if ((label_set_ids == (LabelSetIds *)0x0) == (label_set_lexicon == (IdSetLexicon *)0x0)) {
    this->polylines_ = polylines;
    this->label_set_ids_ = label_set_ids;
    this->label_set_lexicon_ = label_set_lexicon;
    PVar1 = options->polyline_type_;
    (this->options_).edge_type_ = options->edge_type_;
    (this->options_).polyline_type_ = PVar1;
    SVar2 = options->sibling_pairs_;
    (this->options_).duplicate_edges_ = options->duplicate_edges_;
    (this->options_).sibling_pairs_ = SVar2;
    SVar3 = options->s2debug_override_;
    (this->options_).validate_ = options->validate_;
    (this->options_).s2debug_override_ = SVar3;
    return;
  }
  local_30 = options;
  options_local = (Options *)label_set_lexicon;
  label_set_lexicon_local = (IdSetLexicon *)label_set_ids;
  label_set_ids_local = (LabelSetIds *)polylines;
  polylines_local =
       (vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
        *)this;
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_s2polyline_vector_layer.cc"
             ,0x36,kFatal,(ostream *)&std::cerr);
  poVar4 = S2LogMessage::stream(&local_48);
  poVar4 = std::operator<<(poVar4,
                           "Check failed: (label_set_ids == nullptr) == (label_set_lexicon == nullptr) "
                          );
  S2LogMessageVoidify::operator&(&local_31,poVar4);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
}

Assistant:

void S2PolylineVectorLayer::Init(vector<unique_ptr<S2Polyline>>* polylines,
                                 LabelSetIds* label_set_ids,
                                 IdSetLexicon* label_set_lexicon,
                                 const Options& options) {
  S2_DCHECK_EQ(label_set_ids == nullptr, label_set_lexicon == nullptr);
  polylines_ = polylines;
  label_set_ids_ = label_set_ids;
  label_set_lexicon_ = label_set_lexicon;
  options_ = options;
}